

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Scanner::removeStaleSimpleKeyCandidates(Scanner *this)

{
  long *plVar1;
  long *__dest;
  long *plVar2;
  Twine TStack_48;
  
  plVar1 = (long *)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                   super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                   super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                   super_SmallVectorBase.BeginX;
  __dest = plVar1;
  while( true ) {
    plVar2 = __dest;
    while( true ) {
      plVar2 = plVar2 + 3;
      if (__dest == plVar1 + (ulong)(this->SimpleKeys).
                                    super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                                    super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>
                                    .
                                    super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>
                                    .super_SmallVectorBase.Size * 3) {
        return;
      }
      if ((*(uint *)((long)__dest + 0xc) != this->Line) || ((int)__dest[1] + 0x400U < this->Column))
      break;
      __dest = __dest + 3;
    }
    if (*(char *)((long)__dest + 0x14) == '\x01') {
      Twine::Twine(&TStack_48,"Could not find expected : for simple key");
      setError(this,&TStack_48,*(iterator *)(*__dest + 0x18));
      plVar1 = (long *)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                       super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                       super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                       super_SmallVectorBase.BeginX;
    }
    if (__dest < plVar1) break;
    plVar1 = plVar1 + (ulong)(this->SimpleKeys).
                             super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>
                             .super_SmallVectorBase.Size * 3;
    if (plVar1 <= __dest) {
      __assert_fail("I < this->end() && \"Erasing at past-the-end iterator.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x1c2,
                    "iterator llvm::SmallVectorImpl<(anonymous namespace)::SimpleKey>::erase(const_iterator) [T = (anonymous namespace)::SimpleKey]"
                   );
    }
    if (__dest + 3 != plVar1) {
      memmove(__dest,__dest + 3,(long)plVar1 - (long)plVar2);
    }
    SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>::pop_back
              ((SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true> *)&this->SimpleKeys)
    ;
    plVar1 = (long *)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                     super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                     super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                     super_SmallVectorBase.BeginX;
  }
  __assert_fail("I >= this->begin() && \"Iterator to erase is out of bounds.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x1c1,
                "iterator llvm::SmallVectorImpl<(anonymous namespace)::SimpleKey>::erase(const_iterator) [T = (anonymous namespace)::SimpleKey]"
               );
}

Assistant:

void Scanner::removeStaleSimpleKeyCandidates() {
  for (SmallVectorImpl<SimpleKey>::iterator i = SimpleKeys.begin();
                                            i != SimpleKeys.end();) {
    if (i->Line != Line || i->Column + 1024 < Column) {
      if (i->IsRequired)
        setError( "Could not find expected : for simple key"
                , i->Tok->Range.begin());
      i = SimpleKeys.erase(i);
    } else
      ++i;
  }
}